

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgraphel1d.cpp
# Opt level: O1

int __thiscall TPZGraphEl1d::ExportType(TPZGraphEl1d *this,TPZDrawStyle st)

{
  return (uint)(st == EVTKStyle) * 2 + -1;
}

Assistant:

int TPZGraphEl1d::ExportType(TPZDrawStyle st){
	switch(st)
	{
		case(EVTKStyle):
			return 1;
			//		break;
		default:
			return -1;
	}
	//	return -1;
}